

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O1

void __thiscall duckdb::ColumnReader::PrepareDataPage(ColumnReader *this,PageHeader *page_hdr)

{
  uint64_t *puVar1;
  shared_ptr<duckdb::ResizeableBuffer,_true> *psVar2;
  type tVar3;
  type tVar4;
  ulong uVar5;
  _Head_base<0UL,_duckdb::RleBpDecoder_*,_false> _Var6;
  uint *puVar7;
  DataPageHeaderV2 *pDVar8;
  ResizeableBuffer *pRVar9;
  _Head_base<0UL,_duckdb::RleBpDecoder_*,_false> _Var10;
  runtime_error *this_00;
  byte bVar11;
  uint uVar12;
  uint32_t uVar13;
  type *ptVar14;
  uint64_t uVar15;
  
  tVar3 = page_hdr->type;
  if ((tVar3 == DATA_PAGE) && (((byte)page_hdr->__isset & 2) == 0)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(this_00,"Missing data page header from data page");
    goto LAB_01bc3c21;
  }
  if ((tVar3 == DATA_PAGE_V2) && (((byte)page_hdr->__isset & 0x10) == 0)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(this_00,"Missing data page header from data page v2");
    goto LAB_01bc3c21;
  }
  pDVar8 = &page_hdr->data_page_header_v2;
  if (tVar3 == DATA_PAGE) {
    pDVar8 = (DataPageHeaderV2 *)&page_hdr->data_page_header;
  }
  this->page_rows_available = (long)pDVar8->num_values;
  ptVar14 = &(page_hdr->data_page_header).encoding;
  if (tVar3 != DATA_PAGE) {
    ptVar14 = &(page_hdr->data_page_header_v2).encoding;
  }
  tVar4 = *ptVar14;
  if (this->column_schema->max_repeat == 0) {
    if ((tVar3 == DATA_PAGE_V2) &&
       (0 < (page_hdr->data_page_header_v2).repetition_levels_byte_length)) {
      pRVar9 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(&this->block);
      uVar15 = (uint64_t)(page_hdr->data_page_header_v2).repetition_levels_byte_length;
      ByteBuffer::available(&pRVar9->super_ByteBuffer,uVar15);
      goto LAB_01bc39b0;
    }
  }
  else {
    if (tVar3 == DATA_PAGE) {
      pRVar9 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(&this->block);
      ByteBuffer::available(&pRVar9->super_ByteBuffer,4);
      puVar7 = (uint *)(pRVar9->super_ByteBuffer).ptr;
      uVar12 = *puVar7;
      puVar1 = &(pRVar9->super_ByteBuffer).len;
      *puVar1 = *puVar1 - 4;
      (pRVar9->super_ByteBuffer).ptr = (data_ptr_t)(puVar7 + 1);
    }
    else {
      uVar12 = (page_hdr->data_page_header_v2).repetition_levels_byte_length;
    }
    psVar2 = &this->block;
    pRVar9 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(psVar2);
    uVar15 = (uint64_t)uVar12;
    ByteBuffer::available(&pRVar9->super_ByteBuffer,uVar15);
    pRVar9 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(psVar2);
    uVar5 = this->column_schema->max_repeat;
    if (uVar5 == 0) {
      uVar13 = 0;
    }
    else {
      bVar11 = 0;
      do {
        bVar11 = bVar11 + 1;
      } while (uVar5 >> (bVar11 & 0x3f) != 0);
      uVar13 = (uint32_t)bVar11;
    }
    _Var10._M_head_impl = (RleBpDecoder *)operator_new(0x40);
    RleBpDecoder::RleBpDecoder(_Var10._M_head_impl,(pRVar9->super_ByteBuffer).ptr,uVar12,uVar13);
    _Var6._M_head_impl =
         (this->repeated_decoder).
         super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
         super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>.
         super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>._M_head_impl;
    (this->repeated_decoder).
    super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
    super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>.
    super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>._M_head_impl = _Var10._M_head_impl;
    if (_Var6._M_head_impl != (RleBpDecoder *)0x0) {
      operator_delete(_Var6._M_head_impl);
    }
    pRVar9 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(psVar2);
    ByteBuffer::available(&pRVar9->super_ByteBuffer,uVar15);
LAB_01bc39b0:
    puVar1 = &(pRVar9->super_ByteBuffer).len;
    *puVar1 = *puVar1 - uVar15;
    (pRVar9->super_ByteBuffer).ptr = (pRVar9->super_ByteBuffer).ptr + uVar15;
  }
  if (this->column_schema->max_define == 0) {
    if ((tVar3 == DATA_PAGE_V2) &&
       (0 < (page_hdr->data_page_header_v2).definition_levels_byte_length)) {
      pRVar9 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(&this->block);
      uVar15 = (uint64_t)(page_hdr->data_page_header_v2).definition_levels_byte_length;
      goto LAB_01bc3aad;
    }
  }
  else {
    if (tVar3 == DATA_PAGE) {
      pRVar9 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(&this->block);
      ByteBuffer::available(&pRVar9->super_ByteBuffer,4);
      puVar7 = (uint *)(pRVar9->super_ByteBuffer).ptr;
      uVar12 = *puVar7;
      puVar1 = &(pRVar9->super_ByteBuffer).len;
      *puVar1 = *puVar1 - 4;
      (pRVar9->super_ByteBuffer).ptr = (data_ptr_t)(puVar7 + 1);
    }
    else {
      uVar12 = (page_hdr->data_page_header_v2).definition_levels_byte_length;
    }
    psVar2 = &this->block;
    pRVar9 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(psVar2);
    uVar15 = (uint64_t)uVar12;
    ByteBuffer::available(&pRVar9->super_ByteBuffer,uVar15);
    pRVar9 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(psVar2);
    uVar5 = this->column_schema->max_define;
    if (uVar5 == 0) {
      uVar13 = 0;
    }
    else {
      bVar11 = 0;
      do {
        bVar11 = bVar11 + 1;
      } while (uVar5 >> (bVar11 & 0x3f) != 0);
      uVar13 = (uint32_t)bVar11;
    }
    _Var10._M_head_impl = (RleBpDecoder *)operator_new(0x40);
    RleBpDecoder::RleBpDecoder(_Var10._M_head_impl,(pRVar9->super_ByteBuffer).ptr,uVar12,uVar13);
    _Var6._M_head_impl =
         (this->defined_decoder).
         super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
         super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>.
         super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>._M_head_impl;
    (this->defined_decoder).
    super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
    super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>.
    super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>._M_head_impl = _Var10._M_head_impl;
    if (_Var6._M_head_impl != (RleBpDecoder *)0x0) {
      operator_delete(_Var6._M_head_impl);
    }
    pRVar9 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(psVar2);
LAB_01bc3aad:
    ByteBuffer::available(&pRVar9->super_ByteBuffer,uVar15);
    puVar1 = &(pRVar9->super_ByteBuffer).len;
    *puVar1 = *puVar1 - uVar15;
    (pRVar9->super_ByteBuffer).ptr = (pRVar9->super_ByteBuffer).ptr + uVar15;
  }
  switch(tVar4) {
  case PLAIN:
    this->encoding = PLAIN;
    return;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(this_00,"Unsupported page encoding");
    break;
  case PLAIN_DICTIONARY:
  case RLE_DICTIONARY:
    this->encoding = DICTIONARY;
    DictionaryDecoder::InitializePage(&this->dictionary_decoder);
    return;
  case RLE:
    this->encoding = RLE;
    RLEDecoder::InitializePage(&this->rle_decoder);
    return;
  case DELTA_BINARY_PACKED:
    this->encoding = DELTA_BINARY_PACKED;
    DeltaBinaryPackedDecoder::InitializePage(&this->delta_binary_packed_decoder);
    return;
  case DELTA_LENGTH_BYTE_ARRAY:
    this->encoding = DELTA_LENGTH_BYTE_ARRAY;
    DeltaLengthByteArrayDecoder::InitializePage(&this->delta_length_byte_array_decoder);
    return;
  case DELTA_BYTE_ARRAY:
    this->encoding = DELTA_BYTE_ARRAY;
    DeltaByteArrayDecoder::InitializePage(&this->delta_byte_array_decoder);
    return;
  case BYTE_STREAM_SPLIT:
    this->encoding = BYTE_STREAM_SPLIT;
    ByteStreamSplitDecoder::InitializePage(&this->byte_stream_split_decoder);
    return;
  }
LAB_01bc3c21:
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ColumnReader::PrepareDataPage(PageHeader &page_hdr) {
	if (page_hdr.type == PageType::DATA_PAGE && !page_hdr.__isset.data_page_header) {
		throw std::runtime_error("Missing data page header from data page");
	}
	if (page_hdr.type == PageType::DATA_PAGE_V2 && !page_hdr.__isset.data_page_header_v2) {
		throw std::runtime_error("Missing data page header from data page v2");
	}

	bool is_v1 = page_hdr.type == PageType::DATA_PAGE;
	bool is_v2 = page_hdr.type == PageType::DATA_PAGE_V2;
	auto &v1_header = page_hdr.data_page_header;
	auto &v2_header = page_hdr.data_page_header_v2;

	page_rows_available = is_v1 ? v1_header.num_values : v2_header.num_values;
	auto page_encoding = is_v1 ? v1_header.encoding : v2_header.encoding;

	if (HasRepeats()) {
		uint32_t rep_length = is_v1 ? block->read<uint32_t>() : v2_header.repetition_levels_byte_length;
		block->available(rep_length);
		repeated_decoder = make_uniq<RleBpDecoder>(block->ptr, rep_length, RleBpDecoder::ComputeBitWidth(MaxRepeat()));
		block->inc(rep_length);
	} else if (is_v2 && v2_header.repetition_levels_byte_length > 0) {
		block->inc(v2_header.repetition_levels_byte_length);
	}

	if (HasDefines()) {
		uint32_t def_length = is_v1 ? block->read<uint32_t>() : v2_header.definition_levels_byte_length;
		block->available(def_length);
		defined_decoder = make_uniq<RleBpDecoder>(block->ptr, def_length, RleBpDecoder::ComputeBitWidth(MaxDefine()));
		block->inc(def_length);
	} else if (is_v2 && v2_header.definition_levels_byte_length > 0) {
		block->inc(v2_header.definition_levels_byte_length);
	}

	switch (page_encoding) {
	case Encoding::RLE_DICTIONARY:
	case Encoding::PLAIN_DICTIONARY: {
		encoding = ColumnEncoding::DICTIONARY;
		dictionary_decoder.InitializePage();
		break;
	}
	case Encoding::RLE: {
		encoding = ColumnEncoding::RLE;
		rle_decoder.InitializePage();
		break;
	}
	case Encoding::DELTA_BINARY_PACKED: {
		encoding = ColumnEncoding::DELTA_BINARY_PACKED;
		delta_binary_packed_decoder.InitializePage();
		break;
	}
	case Encoding::DELTA_LENGTH_BYTE_ARRAY: {
		encoding = ColumnEncoding::DELTA_LENGTH_BYTE_ARRAY;
		delta_length_byte_array_decoder.InitializePage();
		break;
	}
	case Encoding::DELTA_BYTE_ARRAY: {
		encoding = ColumnEncoding::DELTA_BYTE_ARRAY;
		delta_byte_array_decoder.InitializePage();
		break;
	}
	case Encoding::BYTE_STREAM_SPLIT: {
		encoding = ColumnEncoding::BYTE_STREAM_SPLIT;
		byte_stream_split_decoder.InitializePage();
		break;
	}
	case Encoding::PLAIN:
		// nothing to do here, will be read directly below
		encoding = ColumnEncoding::PLAIN;
		break;

	default:
		throw std::runtime_error("Unsupported page encoding");
	}
}